

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

_Bool player_get_resume_normal_shape(player *p,command_conflict *cmd)

{
  _Bool _Var1;
  char cVar2;
  char *pcVar3;
  char local_88 [7];
  char answer;
  char prompt [100];
  command_conflict *cmd_local;
  player *p_local;
  
  unique0x100000c3 = cmd;
  _Var1 = player_is_shapechanged(p);
  if (_Var1) {
    msg("You cannot do this while in %s form.",p->shape->name);
    pcVar3 = cmd_verb(stack0xffffffffffffffe0->code);
    strnfmt(local_88,100,"Change back and %s (y/n) or (r)eturn to normal? ",pcVar3);
    cVar2 = get_char(local_88,"yrn",3,'n');
    if ((cVar2 == 'y') || (cVar2 == 'r')) {
      player_resume_normal_shape(p);
    }
    p_local._7_1_ = cVar2 == 'y';
  }
  else {
    p_local._7_1_ = true;
  }
  return p_local._7_1_;
}

Assistant:

bool player_get_resume_normal_shape(struct player *p, struct command *cmd)
{
	if (player_is_shapechanged(p)) {
		msg("You cannot do this while in %s form.", p->shape->name);
		char prompt[100];
		strnfmt(prompt, sizeof(prompt),
		        "Change back and %s (y/n) or (r)eturn to normal? ",
		        cmd_verb(cmd->code));
		char answer = get_char(prompt, "yrn", 3, 'n');

		// Change back to normal shape
		if (answer == 'y' || answer == 'r') {
			player_resume_normal_shape(p);
		}

		// Players may only act if they return to normal shape
		return answer == 'y';
	}

	// Normal shape players can proceed as usual
	return true;
}